

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.h
# Opt level: O0

void __thiscall
re2::ExhaustiveTester::ExhaustiveTester
          (ExhaustiveTester *this,int maxatoms,int maxops,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alphabet,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ops,int maxstrlen,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stralphabet,string *wrapper,string *topwrapper)

{
  int maxstrlen_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ops_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *alphabet_local;
  int maxops_local;
  int maxatoms_local;
  ExhaustiveTester *this_local;
  
  RegexpGenerator::RegexpGenerator(&this->super_RegexpGenerator,maxatoms,maxops,alphabet,ops);
  (this->super_RegexpGenerator)._vptr_RegexpGenerator =
       (_func_int **)&PTR__ExhaustiveTester_001c8300;
  StringGenerator::StringGenerator(&this->strgen_,maxstrlen,stralphabet);
  std::__cxx11::string::string((string *)&this->wrapper_,(string *)wrapper);
  std::__cxx11::string::string((string *)&this->topwrapper_,(string *)topwrapper);
  this->regexps_ = 0;
  this->tests_ = 0;
  this->failures_ = 0;
  this->randomstrings_ = false;
  this->stringseed_ = 0;
  this->stringcount_ = 0;
  return;
}

Assistant:

ExhaustiveTester(int maxatoms,
                   int maxops,
                   const vector<string>& alphabet,
                   const vector<string>& ops,
                   int maxstrlen,
                   const vector<string>& stralphabet,
                   const string& wrapper,
                   const string& topwrapper)
    : RegexpGenerator(maxatoms, maxops, alphabet, ops),
      strgen_(maxstrlen, stralphabet),
      wrapper_(wrapper),
      topwrapper_(topwrapper),
      regexps_(0), tests_(0), failures_(0),
      randomstrings_(0), stringseed_(0), stringcount_(0)  { }